

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void anon_unknown.dwarf_4ca1dc::sha256::Transform(uint32_t *s,uchar *chunk,size_t blocks)

{
  long in_RDX;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t in_stack_fffffffffffff89c;
  uint32_t *in_stack_fffffffffffff8a0;
  uint32_t *puVar1;
  uint32_t in_stack_fffffffffffff8b0;
  uint32_t in_stack_fffffffffffff8b4;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t c_00;
  uint32_t b_00;
  uint32_t a_00;
  uint32_t in_stack_fffffffffffff8e0;
  uint32_t in_stack_fffffffffffff8e8;
  uint32_t in_stack_fffffffffffff8ec;
  uint32_t in_stack_fffffffffffff8f0;
  long local_40;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t local_10;
  uint32_t local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in_RDX;
  while (local_40 != 0) {
    uVar2 = *in_RDI;
    uVar3 = in_RDI[1];
    local_14 = in_RDI[2];
    local_18 = in_RDI[3];
    c_00 = in_RDI[4];
    b_00 = in_RDI[5];
    a_00 = in_RDI[6];
    local_28 = in_RDI[7];
    local_24 = a_00;
    local_20 = b_00;
    local_1c = c_00;
    local_10 = uVar3;
    local_c = uVar2;
    ReadBE32((uchar *)in_stack_fffffffffffff8a0);
    puVar1 = &local_28;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    in_stack_fffffffffffff8e0 = local_1c;
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_24;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    in_stack_fffffffffffff8e8 = local_24;
    in_stack_fffffffffffff8ec = local_28;
    in_stack_fffffffffffff8f0 = local_c;
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_20;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_1c;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_18;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_14;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_10;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_c;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_28;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_24;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_20;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_1c;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_18;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_14;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    puVar1 = &local_10;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    ReadBE32((uchar *)puVar1);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    sigma1(in_stack_fffffffffffff89c);
    sigma0(in_stack_fffffffffffff89c);
    in_stack_fffffffffffff8a0 = &local_c;
    Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffff8b4,
          in_stack_fffffffffffff8b0,in_stack_fffffffffffff8e0,
          (uint32_t *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
          in_stack_fffffffffffff8f0);
    *in_RDI = local_c + *in_RDI;
    in_RDI[1] = local_10 + in_RDI[1];
    in_RDI[2] = local_14 + in_RDI[2];
    in_RDI[3] = local_18 + in_RDI[3];
    in_RDI[4] = local_1c + in_RDI[4];
    in_RDI[5] = local_20 + in_RDI[5];
    in_RDI[6] = local_24 + in_RDI[6];
    in_RDI[7] = local_28 + in_RDI[7];
    local_40 = local_40 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk, size_t blocks)
{
    while (blocks--) {
        uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
        uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

        Round(a, b, c, d, e, f, g, h, 0x428a2f98 + (w0 = ReadBE32(chunk + 0)));
        Round(h, a, b, c, d, e, f, g, 0x71374491 + (w1 = ReadBE32(chunk + 4)));
        Round(g, h, a, b, c, d, e, f, 0xb5c0fbcf + (w2 = ReadBE32(chunk + 8)));
        Round(f, g, h, a, b, c, d, e, 0xe9b5dba5 + (w3 = ReadBE32(chunk + 12)));
        Round(e, f, g, h, a, b, c, d, 0x3956c25b + (w4 = ReadBE32(chunk + 16)));
        Round(d, e, f, g, h, a, b, c, 0x59f111f1 + (w5 = ReadBE32(chunk + 20)));
        Round(c, d, e, f, g, h, a, b, 0x923f82a4 + (w6 = ReadBE32(chunk + 24)));
        Round(b, c, d, e, f, g, h, a, 0xab1c5ed5 + (w7 = ReadBE32(chunk + 28)));
        Round(a, b, c, d, e, f, g, h, 0xd807aa98 + (w8 = ReadBE32(chunk + 32)));
        Round(h, a, b, c, d, e, f, g, 0x12835b01 + (w9 = ReadBE32(chunk + 36)));
        Round(g, h, a, b, c, d, e, f, 0x243185be + (w10 = ReadBE32(chunk + 40)));
        Round(f, g, h, a, b, c, d, e, 0x550c7dc3 + (w11 = ReadBE32(chunk + 44)));
        Round(e, f, g, h, a, b, c, d, 0x72be5d74 + (w12 = ReadBE32(chunk + 48)));
        Round(d, e, f, g, h, a, b, c, 0x80deb1fe + (w13 = ReadBE32(chunk + 52)));
        Round(c, d, e, f, g, h, a, b, 0x9bdc06a7 + (w14 = ReadBE32(chunk + 56)));
        Round(b, c, d, e, f, g, h, a, 0xc19bf174 + (w15 = ReadBE32(chunk + 60)));

        Round(a, b, c, d, e, f, g, h, 0xe49b69c1 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0xefbe4786 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x0fc19dc6 + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x240ca1cc + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x2de92c6f + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4a7484aa + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5cb0a9dc + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x76f988da + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x983e5152 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa831c66d + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xb00327c8 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xbf597fc7 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xc6e00bf3 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd5a79147 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0x06ca6351 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x14292967 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x27b70a85 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x2e1b2138 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x53380d13 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x650a7354 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x766a0abb + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x81c2c92e + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x92722c85 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa81a664b + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xc24b8b70 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xc76c51a3 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xd192e819 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd6990624 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xf40e3585 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x106aa070 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x19a4c116 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x1e376c08 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x2748774c + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x34b0bcb5 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x391c0cb3 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4ed8aa4a + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5b9cca4f + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x682e6ff3 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x748f82ee + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0x78a5636f + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0x84c87814 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0x8cc70208 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0x90befffa + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xa4506ceb + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xbef9a3f7 + (w14 + sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0xc67178f2 + (w15 + sigma1(w13) + w8 + sigma0(w0)));

        s[0] += a;
        s[1] += b;
        s[2] += c;
        s[3] += d;
        s[4] += e;
        s[5] += f;
        s[6] += g;
        s[7] += h;
        chunk += 64;
    }
}